

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ListColumnData::InitializeColumn
          (ListColumnData *this,PersistentColumnData *column_data,BaseStatistics *target_stats)

{
  reference pvVar1;
  BaseStatistics *pBVar2;
  pointer pCVar3;
  
  ColumnData::InitializeColumn(&this->super_ColumnData,column_data,target_stats);
  pvVar1 = vector<duckdb::PersistentColumnData,_true>::operator[](&column_data->child_columns,0);
  ColumnData::InitializeColumn(&(this->validity).super_ColumnData,pvVar1,target_stats);
  pBVar2 = ListStats::GetChildStats(target_stats);
  pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pvVar1 = vector<duckdb::PersistentColumnData,_true>::operator[](&column_data->child_columns,1);
  (*pCVar3->_vptr_ColumnData[0x20])(pCVar3,pvVar1,pBVar2,pCVar3->_vptr_ColumnData[0x20]);
  return;
}

Assistant:

void ListColumnData::InitializeColumn(PersistentColumnData &column_data, BaseStatistics &target_stats) {
	ColumnData::InitializeColumn(column_data, target_stats);
	validity.InitializeColumn(column_data.child_columns[0], target_stats);
	auto &child_stats = ListStats::GetChildStats(target_stats);
	child_column->InitializeColumn(column_data.child_columns[1], child_stats);
}